

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlFAGenerateCountedTransition
               (xmlRegParserCtxtPtr ctxt,xmlRegStatePtr from,xmlRegStatePtr to,int counter)

{
  if (to == (xmlRegStatePtr)0x0) {
    to = (xmlRegStatePtr)(*xmlMalloc)(0x38);
    if (to == (xmlRegStatePtr)0x0) {
      xmlRegexpErrMemory(ctxt,"allocating state");
      to = (xmlRegStatePtr)0x0;
    }
    else {
      to->type = 0;
      to->mark = XML_REGEXP_MARK_NORMAL;
      to->markd = XML_REGEXP_MARK_NORMAL;
      to->reached = XML_REGEXP_MARK_NORMAL;
      to->trans = (xmlRegTrans *)0x0;
      to->maxTransTo = 0;
      to->nbTransTo = 0;
      to->no = 0;
      to->maxTrans = 0;
      *(undefined8 *)&to->nbTrans = 0;
      to->transTo = (int *)0x0;
      to->type = XML_REGEXP_TRANS_STATE;
      to->mark = XML_REGEXP_MARK_NORMAL;
    }
    xmlRegStatePush(ctxt,to);
    ctxt->state = to;
  }
  xmlRegStateAddTrans(ctxt,from,(xmlRegAtomPtr)0x0,to,-1,counter);
  return;
}

Assistant:

static void
xmlFAGenerateCountedTransition(xmlRegParserCtxtPtr ctxt,
	    xmlRegStatePtr from, xmlRegStatePtr to, int counter) {
    if (to == NULL) {
	to = xmlRegNewState(ctxt);
	xmlRegStatePush(ctxt, to);
	ctxt->state = to;
    }
    xmlRegStateAddTrans(ctxt, from, NULL, to, -1, counter);
}